

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

int * int32Calloc(int n)

{
  int *__s;
  char msg [256];
  char acStack_118 [256];
  
  __s = (int *)malloc((long)n << 2);
  if (__s == (int *)0x0) {
    sprintf(acStack_118,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for buf in intCalloc()",
            0xad,"/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/memory.c"
           );
    superlu_abort_and_exit(acStack_118);
  }
  if (0 < n) {
    memset(__s,0,(ulong)(uint)n << 2);
  }
  return __s;
}

Assistant:

int *int32Calloc(int n)
{
    int *buf;
    register int i;
    buf = (int *) SUPERLU_MALLOC(n * sizeof(int));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC fails for buf in intCalloc()");
    }
    for (i = 0; i < n; ++i) buf[i] = 0;
    return (buf);
}